

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O3

void Wlc_NtkExploreMem_rec(Wlc_Ntk_t *p,Wlc_Obj_t *pObj,Vec_Int_t *vCollect,int nFrames)

{
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar1;
  ulong uVar2;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  
  uVar3 = *(ushort *)pObj;
  if (-1 < (char)uVar3) {
    return;
  }
  while( true ) {
    uVar3 = uVar3 & 0x3f;
    if ((uVar3 == 1) || ((nFrames == 0 && (uVar3 == 3)))) {
      iVar5 = (int)((ulong)((long)pObj - (long)p->pObjs) >> 3) * -0x55555555;
      if (0 < (long)vCollect->nSize) {
        lVar6 = 0;
        do {
          if (vCollect->pArray[lVar6] == iVar5) {
            return;
          }
          lVar6 = lVar6 + 1;
        } while (vCollect->nSize != lVar6);
      }
      Vec_IntPush(vCollect,iVar5);
      return;
    }
    if (uVar3 != 3) break;
    uVar4 = ((pObj->field_10).Fanins[1] + (p->vPos).nSize) - (p->vPis).nSize;
    if (((int)uVar4 < 0) || ((p->vCos).nSize <= (int)uVar4)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar5 = (p->vCos).pArray[uVar4];
    if (((long)iVar5 < 1) || (p->nObjsAlloc <= iVar5)) goto LAB_00361c10;
    pObj = p->pObjs + iVar5;
    uVar3 = *(ushort *)pObj;
    nFrames = nFrames + -1;
    if (-1 < (char)uVar3) {
      return;
    }
  }
  uVar2 = (ulong)pObj->nFanins;
  if ((int)pObj->nFanins < 1) {
    return;
  }
  lVar6 = 0;
  while( true ) {
    if ((2 < (uint)uVar2) || (paVar1 = &pObj->field_10, (*(uint *)pObj & 0x3f | 0x10) == 0x16)) {
      paVar1 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pObj->field_10).pFanins[0];
    }
    iVar5 = paVar1->Fanins[lVar6];
    if (((long)iVar5 < 1) || (p->nObjsAlloc <= iVar5)) break;
    Wlc_NtkExploreMem_rec(p,p->pObjs + iVar5,vCollect,nFrames);
    lVar6 = lVar6 + 1;
    uVar2 = (ulong)(int)pObj->nFanins;
    if ((long)uVar2 <= lVar6) {
      return;
    }
  }
LAB_00361c10:
  __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
}

Assistant:

void Wlc_NtkExploreMem_rec( Wlc_Ntk_t * p, Wlc_Obj_t * pObj, Vec_Int_t * vCollect, int nFrames )
{
    int k, iFanin;
    if ( pObj->Mark == 0 )
        return;
    if ( Wlc_ObjType(pObj) == WLC_OBJ_PI || (Wlc_ObjType(pObj) == WLC_OBJ_FO && nFrames == 0) )
    {
        Vec_IntPushUnique( vCollect, Wlc_ObjId(p, pObj) );
        return;
    }
    if ( Wlc_ObjType(pObj) == WLC_OBJ_FO )
    {
        Wlc_NtkExploreMem_rec( p, Wlc_ObjFo2Fi(p, pObj), vCollect, nFrames-1 );
        return;
    }
    Wlc_ObjForEachFanin( pObj, iFanin, k )
        Wlc_NtkExploreMem_rec( p, Wlc_NtkObj(p, iFanin), vCollect, nFrames );
}